

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

void __thiscall Mems::find_samples_next_to_mirror_fast(Mems *this,Portioner *buckets)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  pointer pPVar5;
  reference __x;
  size_type sVar6;
  ostream *poVar7;
  pointer pMVar8;
  iterator __first;
  iterator __last;
  __type _Var9;
  __type _Var10;
  undefined1 auVar11 [16];
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_b0;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_a8;
  iterator mirror;
  int progress;
  double sample_dis;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_88;
  iterator point_to_check;
  __normal_iterator<std::vector<Point_d,_std::allocator<Point_d>_>_*,_std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>
  local_68;
  iterator cluster_part;
  vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  point_cluster;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_40;
  iterator selected_mirror;
  int min_samples;
  int max_samples;
  int mirrornumber;
  bool enough_samples;
  int not_matching_mirror_ammount;
  int x_y_distance_max;
  int x_y_distance;
  int minfittingsamples;
  Portioner *buckets_local;
  Mems *this_local;
  
  x_y_distance_max = 999999;
  selected_mirror._M_current._4_4_ = 5;
  selected_mirror._M_current._0_4_ = 2;
  local_40._M_current =
       (Mirror *)std::begin<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
  do {
    point_cluster.
    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::end<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
    bVar3 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> *
                       )&point_cluster.
                         super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) {
      poVar7 = std::operator<<((ostream *)&std::cout,"All samples for Mirrors found");
      std::operator<<(poVar7,'\n');
      local_a8._M_current =
           (Mirror *)std::begin<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
      while( true ) {
        local_b0._M_current =
             (Mirror *)std::end<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
        bVar3 = __gnu_cxx::operator!=(&local_a8,&local_b0);
        if (!bVar3) break;
        pMVar8 = __gnu_cxx::
                 __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                 operator->(&local_a8);
        __first = std::vector<Point_d,_std::allocator<Point_d>_>::begin(&pMVar8->_matching_samples);
        pMVar8 = __gnu_cxx::
                 __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                 operator->(&local_a8);
        __last = std::vector<Point_d,_std::allocator<Point_d>_>::end(&pMVar8->_matching_samples);
        std::
        sort<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,bool(*)(Point_d_const&,Point_d_const&)>
                  ((__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>)
                   __first._M_current,
                   (__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>)
                   __last._M_current,compare_by_distance);
        __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
        operator++(&local_a8);
      }
      return;
    }
    not_matching_mirror_ammount = 5;
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_40);
    Portioner::get_bucket_cluster
              ((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                *)&cluster_part,buckets,&pMVar8->_position);
    for (; not_matching_mirror_ammount < 0x14;
        not_matching_mirror_ammount = not_matching_mirror_ammount + 2) {
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      std::vector<Point_d,_std::allocator<Point_d>_>::clear(&pMVar8->_matching_samples);
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      pMVar8->_ammount_of_matching_samples = 0;
      local_68._M_current =
           (vector<Point_d,_std::allocator<Point_d>_> *)
           std::
           begin<std::vector<std::vector<Point_d,std::allocator<Point_d>>,std::allocator<std::vector<Point_d,std::allocator<Point_d>>>>>
                     ((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                       *)&cluster_part);
      while( true ) {
        point_to_check._M_current =
             (Point_d *)
             std::
             end<std::vector<std::vector<Point_d,std::allocator<Point_d>>,std::allocator<std::vector<Point_d,std::allocator<Point_d>>>>>
                       ((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                         *)&cluster_part);
        bVar3 = __gnu_cxx::operator!=
                          (&local_68,
                           (__normal_iterator<std::vector<Point_d,_std::allocator<Point_d>_>_*,_std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>
                            *)&point_to_check);
        if (!bVar3) break;
        pvVar4 = __gnu_cxx::
                 __normal_iterator<std::vector<Point_d,_std::allocator<Point_d>_>_*,_std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>
                 ::operator*(&local_68);
        local_88._M_current =
             (Point_d *)std::begin<std::vector<Point_d,std::allocator<Point_d>>>(pvVar4);
        while( true ) {
          pvVar4 = __gnu_cxx::
                   __normal_iterator<std::vector<Point_d,_std::allocator<Point_d>_>_*,_std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>
                   ::operator*(&local_68);
          sample_dis = (double)std::end<std::vector<Point_d,std::allocator<Point_d>>>(pvVar4);
          bVar3 = __gnu_cxx::operator!=
                            (&local_88,
                             (__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>
                              *)&sample_dis);
          if (!bVar3) break;
          pMVar8 = __gnu_cxx::
                   __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                   operator->(&local_40);
          dVar1 = (pMVar8->_position).x;
          pPVar5 = __gnu_cxx::
                   __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                   operator->(&local_88);
          _Var9 = std::pow<double,int>(dVar1 - pPVar5->x,2);
          pMVar8 = __gnu_cxx::
                   __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                   operator->(&local_40);
          dVar1 = (pMVar8->_position).y;
          pPVar5 = __gnu_cxx::
                   __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                   operator->(&local_88);
          _Var10 = std::pow<double,int>(dVar1 - pPVar5->y,2);
          if (_Var9 + _Var10 <=
              (double)(not_matching_mirror_ammount * not_matching_mirror_ammount * 2)) {
            pPVar5 = __gnu_cxx::
                     __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                     operator->(&local_88);
            pPVar5->dis = _Var9 + _Var10;
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                     operator->(&local_40);
            __x = __gnu_cxx::
                  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                  operator*(&local_88);
            std::vector<Point_d,_std::allocator<Point_d>_>::push_back
                      (&pMVar8->_matching_samples,__x);
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                     operator->(&local_40);
            iVar2 = pMVar8->_ammount_of_matching_samples;
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                     operator->(&local_40);
            pMVar8->_ammount_of_matching_samples = iVar2 + 1;
          }
          __gnu_cxx::__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
          operator++(&local_88);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<Point_d,_std::allocator<Point_d>_>_*,_std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>
        ::operator++(&local_68);
      }
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      sVar6 = std::vector<Point_d,_std::allocator<Point_d>_>::size(&pMVar8->_matching_samples);
      if (4 < sVar6) break;
    }
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_40);
    if (pMVar8->id % 10000 == 0) {
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      iVar2 = pMVar8->id;
      sVar6 = std::vector<Mirror,_std::allocator<Mirror>_>::size(&this->_mems_mirrors);
      auVar11._8_4_ = (int)(sVar6 >> 0x20);
      auVar11._0_8_ = sVar6;
      auVar11._12_4_ = 0x45300000;
      mirror._M_current._4_4_ =
           (int)(((double)iVar2 /
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0))) * 100.0);
      poVar7 = std::operator<<((ostream *)&std::cout,"Find samples for all Mems-Mirrors  ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,mirror._M_current._4_4_);
      std::operator<<(poVar7," % . \n");
    }
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_40);
    sVar6 = std::vector<Point_d,_std::allocator<Point_d>_>::size(&pMVar8->_matching_samples);
    if (sVar6 < (ulong)(long)x_y_distance_max) {
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      sVar6 = std::vector<Point_d,_std::allocator<Point_d>_>::size(&pMVar8->_matching_samples);
      x_y_distance_max = (int)sVar6;
    }
    if (x_y_distance_max == 0) {
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      std::vector<Point_d,_std::allocator<Point_d>_>::size(&pMVar8->_matching_samples);
    }
    std::
    vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
    ::~vector((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
               *)&cluster_part);
    __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
    operator++(&local_40);
  } while( true );
}

Assistant:

void Mems::find_samples_next_to_mirror_fast(Portioner buckets){
        int       minfittingsamples = 999999;           //DeBUG
        int       x_y_distance;
  const int       x_y_distance_max = 20;                //maximum Distance between Mirror and Sample for x and y
        int       not_matching_mirror_ammount = 0;      //DebUG needed?

        bool      enough_samples;                       // needed?
        int       mirrornumber = 0;                     //ID

  const int       max_samples = 5;                      //max Ammount of needed Samples
  const int       min_samples = 2;


  //iterate selected_mirror all buckets
  for(auto selected_mirror = std::begin(_mems_mirrors); selected_mirror!=std::end(_mems_mirrors); ++selected_mirror){
    mirrornumber += 1;
    x_y_distance = 5;
    enough_samples = false;
    //fill vec with all relevant samplepoints with samples from mirrorbucket and buckets arround
    std::vector<std::vector<Point_d>>point_cluster = buckets.get_bucket_cluster(selected_mirror->_position);
  //  std::cout<<"id: "<<selected_mirror->id<<"\n";
  //  std::cout<<"size: \n";
/*
    int point_amm_in_cluster = 0;
    for(auto it = std::begin(point_cluster); it != std::end(point_cluster); it++){
      point_amm_in_cluster = point_amm_in_cluster+it->size();
    }

    std::cout<<"looking for samples for mirror "<< mirrornumber<<" with "<<point_amm_in_cluster<<" Points in MirrorCluster"<<"\n";
*/
    while(x_y_distance<x_y_distance_max ){
      //  while(x_y_distance<x_y_distance_max || (selected_mirror->_matching_samples.size() < min_samples)){
          selected_mirror->_matching_samples.clear();
          selected_mirror->_ammount_of_matching_samples = 0;
          //      std::cout<<" x_y_distance = "<<x_y_distance<<"\n";
          for(auto cluster_part = std::begin(point_cluster); cluster_part!=std::end(point_cluster); ++cluster_part)
          {
            for(auto point_to_check = std::begin(*cluster_part); point_to_check != std::end(*cluster_part); ++point_to_check)
            {
              //perform this actions for all Samples which are in bucket for mirror


              //----> nicht nötig          //check, if ammount of needed samples is reached
              //----> nicht nötig          //not reached: suche mit der aktuellen sample_distance in den buckets nach reached samples
                                  //  wenn distance <= (maxdis^2)*2
                                  //  put distance to point struct
                                  //  push back point to selected mirror
                                  //  incremet ammountof matching samples im selected mirror
                                  //  if ammount of matching samples = max_sample
                                  // break, go to next mems_mirror

              double sample_dis = pow(selected_mirror->_position.x-point_to_check->x , 2)+pow(selected_mirror->_position.y-point_to_check->y , 2);
              if(sample_dis<=x_y_distance*x_y_distance*2)
              {
                point_to_check->dis = sample_dis;
                selected_mirror->_matching_samples.push_back(*point_to_check);
                selected_mirror->_ammount_of_matching_samples = selected_mirror->_ammount_of_matching_samples +1;
  //              std::cout<<selected_mirror->_matching_samples.size()<<" ";

                //std::cout << "break2 \n" ;
              //  break;

              }
          //  MAXSAMPLES:
            }
          }
            if(selected_mirror->_matching_samples.size() >= max_samples){
            //  goto MAXSAMPLES;
            //    std::cout << "break1 \n" ;
            break;
            }
            x_y_distance += 2;
          }

          if(selected_mirror->id % 10000 == 0)
          {
            int progress = (int)((double)selected_mirror->id/(double)_mems_mirrors.size()*100) ;
            std::cout <<"Find samples for all Mems-Mirrors  "<< progress <<" % . \n";
          }

          if(minfittingsamples > selected_mirror->_matching_samples.size())
          {
            minfittingsamples = selected_mirror->_matching_samples.size();
            //std::cout << "Minimal fitting samples sind jetzt " <<minfittingsamples<<"\n \n";
          }
          if(minfittingsamples == 0 && selected_mirror->_matching_samples.size()==0)
          {
            not_matching_mirror_ammount += 1;
          }
        }
      //      std::cout << "not matching mirrorammount =  " <<not_matching_mirror_ammount<<"\n";
      std::cout << "All samples for Mirrors found"<< '\n';

      for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
      {
        std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
      }

  }